

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

byte_string_view __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
as_byte_string_view(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this
                   )

{
  int64_t iVar1;
  json_runtime_error<std::domain_error,_void> *this_00;
  size_t in_RDX;
  byte *in_RSI;
  byte_string_view bVar2;
  string local_38;
  
  while( true ) {
    if (1 < (*in_RSI & 0xf) - 8) break;
    in_RSI = *(byte **)(in_RSI + 8);
  }
  if ((*in_RSI & 0xf) == 0xc) {
    iVar1 = *(int64_t *)(*(long *)(in_RSI + 8) + 0x18);
    *(undefined8 *)&this->field_0 = *(undefined8 *)(*(long *)(in_RSI + 8) + 0x10);
    (this->field_0).int64_.val_ = iVar1;
    bVar2.size_ = in_RDX;
    bVar2.data_ = (uint8_t *)this;
    return bVar2;
  }
  this_00 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Not a byte string","");
  json_runtime_error<std::domain_error,_void>::json_runtime_error(this_00,&local_38);
  __cxa_throw(this_00,&json_runtime_error<std::domain_error,void>::typeinfo,
              json_runtime_error<std::domain_error,_void>::~json_runtime_error);
}

Assistant:

byte_string_view as_byte_string_view() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                    return byte_string_view(cast<byte_string_storage>().data(),cast<byte_string_storage>().length());
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_byte_string_view();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_byte_string_view();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a byte string"));
            }
        }